

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall fujita_fujitaTests_Test::TestBody(fujita_fujitaTests_Test *this)

{
  double dVar1;
  bool bVar2;
  ParamType *pPVar3;
  char *pcVar4;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  double local_60;
  double local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  double conv;
  double wspeed;
  double fnumber;
  ParamType p;
  fujita_fujitaTests_Test *this_local;
  
  pPVar3 = testing::WithParamInterface<std::pair<double,_float>_>::GetParam();
  dVar1 = pPVar3->first;
  p.first._0_4_ = (float)*(undefined8 *)&pPVar3->second;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )units::convert<units::precise_unit,units::precise_unit>
                   ((double)p.first._0_4_,(precise_unit *)units::precise::mph,
                    (precise_unit *)units::precise::special::fujita);
  local_58 = round((double)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
  local_60 = floor(dVar1);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_50,"std::round(conv)","std::floor(fnumber)",&local_58,&local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(local_78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x1e1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  dVar1 = units::convert<units::precise_unit,units::precise_unit>
                    ((double)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(precise_unit *)units::precise::special::fujita,
                     (precise_unit *)units::precise::mph);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,"convert(conv, precise::special::fujita, precise::mph)","wspeed",
             "0.5",dVar1,(double)p.first._0_4_,0.5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x1e3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST_P(fujita, fujitaTests)
{
    auto p = GetParam();
    auto fnumber = p.first;
    auto wspeed = static_cast<double>(p.second);

    auto conv = convert(wspeed, precise::mph, precise::special::fujita);

    EXPECT_EQ(std::round(conv), std::floor(fnumber));
    EXPECT_NEAR(
        convert(conv, precise::special::fujita, precise::mph), wspeed, 0.5);
}